

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_monster_memory(void)

{
  monster_lore *pmVar1;
  monster_lore *lore;
  monster_race *race;
  wchar_t r_idx;
  
  wr_byte('\x02');
  for (race._4_4_ = 0; pmVar1 = l_list, race._4_4_ < (int)(uint)z_info->r_max;
      race._4_4_ = race._4_4_ + 1) {
    if ((r_info[race._4_4_].name != (char *)0x0) &&
       ((l_list[race._4_4_].pkills != 0 || (l_list[race._4_4_].thefts != 0)))) {
      wr_string(r_info[race._4_4_].name);
      wr_u16b(pmVar1[race._4_4_].pkills);
      wr_u16b(pmVar1[race._4_4_].thefts);
    }
  }
  wr_string("No more monsters");
  return;
}

Assistant:

void wr_monster_memory(void)
{
	int r_idx;

	wr_byte(MFLAG_SIZE);

	for (r_idx = 0; r_idx < z_info->r_max; r_idx++) {
		struct monster_race *race = &r_info[r_idx];
		struct monster_lore *lore = &l_list[r_idx];

		/* Names and kill counts */
		if (!race->name || !(lore->pkills || lore->thefts)) continue;
		wr_string(race->name);
		wr_u16b(lore->pkills);
		wr_u16b(lore->thefts);
	}
	wr_string("No more monsters");
}